

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

char * nn_print_line(FILE *out,char *str,size_t width)

{
  size_t sVar1;
  ushort **ppuVar2;
  uint local_2c;
  int i;
  size_t width_local;
  char *str_local;
  FILE *out_local;
  
  sVar1 = strlen(str);
  if (sVar1 < width) {
    fprintf((FILE *)out,"%s",str);
  }
  else {
    for (local_2c = (uint)width; 1 < (int)local_2c; local_2c = local_2c - 1) {
      ppuVar2 = __ctype_b_loc();
      if (((*ppuVar2)[(int)str[(int)local_2c]] & 0x2000) != 0) {
        fprintf((FILE *)out,"%.*s",(ulong)local_2c,str);
        return str + (long)(int)local_2c + 1;
      }
    }
    fprintf((FILE *)out,"%s",str);
  }
  return "";
}

Assistant:

static char *nn_print_line (FILE *out, char *str, size_t width)
{
    int i;
    if (strlen (str) < width) {
        fprintf (out, "%s", str);
        return "";
    }
    for (i = width; i > 1; --i) {
        if (isspace (str[i])) {
            fprintf (out, "%.*s", i, str);
            return str + i + 1;
        }
    }  /* no break points, just print as is */
    fprintf (out, "%s", str);
    return "";
}